

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O3

bool __thiscall
QDirListingPrivate::matchesFilters(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  QRegularExpression *pQVar1;
  long lVar2;
  QRegularExpression *pQVar3;
  bool bVar4;
  const_iterator cVar5;
  uint uVar6;
  long in_FS_OFFSET;
  QStringView fileName;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QDirEntryInfo::fileName(&local_38,entryInfo);
  if (local_38.d.size != 0) {
    fileName.m_data = local_38.d.ptr;
    fileName.m_size = local_38.d.size;
    bVar4 = isDotOrDotDot(fileName);
    if (bVar4) {
      bVar4 = (bool)((byte)(this->iteratorFlags).
                           super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                           super_QFlagsStorage<QDirListing::IteratorFlag>.i >> 7);
      goto LAB_0022fd3e;
    }
    lVar2 = (this->nameRegExps).d.size;
    if (((lVar2 == 0) ||
        (pQVar3 = (this->nameRegExps).d.ptr, pQVar1 = pQVar3 + lVar2,
        cVar5 = std::
                __find_if<QList<QRegularExpression>::const_iterator,__gnu_cxx::__ops::_Iter_pred<QDirListingPrivate::regexMatchesName(QString_const&)const::_lambda(auto:1_const&)_1_>>
                          (pQVar3,pQVar1,&local_38), cVar5.i != pQVar1)) &&
       ((((this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
          super_QFlagsStorage<QDirListing::IteratorFlag>.i & 0x40) != 0 ||
        (bVar4 = QDirEntryInfo::isHidden(entryInfo), !bVar4)))) {
      bVar4 = QDirEntryInfo::isSymLink(entryInfo);
      uVar6 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
              super_QFlagsStorage<QDirListing::IteratorFlag>.i;
      if (bVar4) {
        if ((uVar6 & 0x20) == 0) {
          if ((uVar6 & 0x1c) == 0) goto LAB_0022fce5;
        }
        else {
          bVar4 = QDirEntryInfo::exists(entryInfo);
          if (bVar4) {
            uVar6 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                    super_QFlagsStorage<QDirListing::IteratorFlag>.i;
            goto LAB_0022fce5;
          }
        }
      }
      else {
LAB_0022fce5:
        if (((((uVar6 & 0x10) == 0) || (bVar4 = QDirEntryInfo::isFile(entryInfo), bVar4)) ||
            (bVar4 = QDirEntryInfo::isDir(entryInfo), bVar4)) ||
           (bVar4 = QDirEntryInfo::isSymLink(entryInfo), bVar4)) {
          uVar6 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                  super_QFlagsStorage<QDirListing::IteratorFlag>.i;
          if ((uVar6 & 8) != 0) {
            bVar4 = QDirEntryInfo::isDir(entryInfo);
            if (bVar4) goto LAB_0022fd3c;
            uVar6 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                    super_QFlagsStorage<QDirListing::IteratorFlag>.i;
          }
          if (((uVar6 & 4) == 0) || (bVar4 = QDirEntryInfo::isFile(entryInfo), !bVar4)) {
            bVar4 = true;
            goto LAB_0022fd3e;
          }
        }
      }
    }
  }
LAB_0022fd3c:
  bVar4 = false;
LAB_0022fd3e:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QDirListingPrivate::matchesFilters(QDirEntryInfo &entryInfo) const
{
    using F = QDirListing::IteratorFlag;

    const QString &fileName = entryInfo.fileName();
    if (fileName.isEmpty())
        return false;

    if (isDotOrDotDot(fileName)) // All done, other checks below don't matter in this case
        return iteratorFlags.testAnyFlags(F::IncludeDotAndDotDot);

    // name filter
#if QT_CONFIG(regularexpression)
    if (!regexMatchesName(fileName))
        return false;
#endif // QT_CONFIG(regularexpression)

    if (!iteratorFlags.testAnyFlag(F::IncludeHidden) && entryInfo.isHidden())
        return false;

    if (entryInfo.isSymLink()) {
        // With ResolveSymlinks, we look at the type of the link's target,
        // and exclude broken symlinks (where the target doesn't exist).
        if (iteratorFlags.testAnyFlag(F::ResolveSymlinks)) {
            if (!entryInfo.exists())
                return false;
        } else if (iteratorFlags.testAnyFlags(F::FilesOnly)
                   || iteratorFlags.testAnyFlags(F::DirsOnly)) {
            return false; // symlink is not a file or dir
        }
    }

    if (iteratorFlags.testAnyFlag(F::ExcludeOther)
        && !entryInfo.isFile() && !entryInfo.isDir() && !entryInfo.isSymLink()) {
        return false;
    }

    if (iteratorFlags.testAnyFlags(F::ExcludeDirs) && entryInfo.isDir())
        return false;

    if (iteratorFlags.testAnyFlags(F::ExcludeFiles) && entryInfo.isFile())
        return false;

    return true;
}